

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadSegs<mapseg4_t>(MapData *map)

{
  ushort uVar1;
  int iVar2;
  FileReader *pFVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  vertex_t *pvVar9;
  vertex_t *pvVar10;
  seg_t *psVar11;
  int iVar12;
  void *__s;
  size_t __n;
  void *pvVar13;
  long lVar14;
  undefined4 *puVar15;
  long lVar16;
  vertex_t **ppvVar17;
  uint uVar18;
  long lVar19;
  line_t *plVar20;
  short *psVar21;
  long lVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  
  uVar23 = (ulong)numvertexes;
  __s = operator_new__(uVar23);
  pFVar3 = map->MapLumps[5].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    memset(__s,0,uVar23);
    numsegs = 0;
  }
  else {
    lVar14 = pFVar3->Length;
    memset(__s,0,uVar23);
    uVar18 = (uint)lVar14;
    numsegs = (int)uVar18 >> 4;
    if (0xf < uVar18) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (long)numsegs;
      __n = SUB168(auVar6 * ZEXT816(0x48),0);
      uVar23 = 0xffffffffffffffff;
      if (SUB168(auVar6 * ZEXT816(0x48),8) == 0) {
        uVar23 = __n;
      }
      segs = (seg_t *)operator_new__(uVar23);
      memset(segs,0,__n);
      pvVar13 = operator_new__((long)(int)uVar18);
      map->file = pFVar3;
      (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
      (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])
                (map->file,pvVar13,(long)(int)uVar18);
      lVar14 = (long)numsubsectors;
      if (0 < lVar14) {
        lVar16 = 0;
        do {
          *(seg_t **)((long)subsectors->portalcoverage + lVar16 + -0x28) =
               segs + *(long *)((long)subsectors->portalcoverage + lVar16 + -0x28);
          lVar16 = lVar16 + 0x60;
        } while (lVar14 * 0x60 != lVar16);
      }
      pvVar9 = vertexes;
      if (0 < numlines) {
        ppvVar17 = &lines->v2;
        iVar12 = numlines;
        do {
          *(undefined1 *)((long)__s + ((long)*ppvVar17 - (long)pvVar9 >> 3) * 0x6db6db6db6db6db7) =
               1;
          *(undefined1 *)
           ((long)__s +
           ((long)((line_t *)(ppvVar17 + -1))->v1 - (long)pvVar9 >> 3) * 0x6db6db6db6db6db7) = 1;
          ppvVar17 = ppvVar17 + 0x13;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      if (0 < numsegs) {
        psVar21 = (short *)((long)pvVar13 + 0xc);
        lVar16 = 0;
        lVar14 = 0;
        do {
          psVar11 = segs;
          pvVar9 = vertexes;
          iVar12 = *(int *)(psVar21 + -6);
          lVar19 = (long)iVar12;
          iVar2 = *(int *)(psVar21 + -4);
          if ((numvertexes <= iVar12) || (numvertexes <= iVar2)) {
            puVar15 = (undefined4 *)__cxa_allocate_exception(0xc);
            if (iVar2 < iVar12) {
              iVar2 = iVar12;
            }
            *puVar15 = 0;
            puVar15[1] = (int)lVar14;
            puVar15[2] = iVar2;
            __cxa_throw(puVar15,&badseg::typeinfo,0);
          }
          lVar22 = (long)iVar2;
          *(vertex_t **)((long)&segs->v1 + lVar16) = vertexes + lVar19;
          pvVar10 = vertexes;
          *(vertex_t **)((long)&psVar11->v2 + lVar16) = vertexes + lVar22;
          uVar1 = psVar21[-2];
          dVar7 = c_atan2(pvVar10[lVar22].p.Y - pvVar9[lVar19].p.Y,
                          pvVar10[lVar22].p.X - pvVar9[lVar19].p.X);
          dVar25 = (double)((ulong)uVar1 << 0x10) * 8.381903171539307e-08;
          if (1.0 <= ABS((double)SUB84((dVar7 * 57.29577951308232 - dVar25) * 11930464.711111112 +
                                       6755399441055744.0,0) * 8.381903171539307e-08)) {
            pdVar4 = *(double **)((long)&psVar11->v1 + lVar16);
            pdVar5 = *(double **)((long)&psVar11->v2 + lVar16);
            dVar24 = *pdVar5 - *pdVar4;
            dVar7 = pdVar5[1] - pdVar4[1];
            dVar7 = c_sqrt(dVar7 * dVar7 + dVar24 * dVar24);
            dVar25 = FFastTrig::cos(&fasttrig,dVar25 * 11930464.711111112 + 6755399441055744.0);
            dVar24 = FFastTrig::sin(&fasttrig,dVar25);
            if ((iVar12 < iVar2) && (*(char *)((long)__s + lVar22) == '\0')) {
              pdVar4 = *(double **)((long)&psVar11->v1 + lVar16);
              pdVar5 = *(double **)((long)&psVar11->v2 + lVar16);
              dVar8 = pdVar4[1];
              *pdVar5 = dVar25 * dVar7 + *pdVar4;
              pdVar5[1] = dVar24 * dVar7 + dVar8;
            }
            else {
              if (*(char *)((long)__s + lVar19) != '\0') goto LAB_0056ac7e;
              pdVar4 = *(double **)((long)&psVar11->v1 + lVar16);
              pdVar5 = *(double **)((long)&psVar11->v2 + lVar16);
              dVar8 = pdVar5[1];
              *pdVar4 = *pdVar5 - dVar25 * dVar7;
              pdVar4[1] = dVar8 - dVar24 * dVar7;
              lVar22 = lVar19;
            }
            *(undefined1 *)(lVar22 + (long)__s) = 1;
          }
LAB_0056ac7e:
          uVar1 = psVar21[-1];
          uVar18 = (uint)uVar1;
          if ((uint)numlines <= (uint)uVar1) {
            puVar15 = (undefined4 *)__cxa_allocate_exception(0xc);
            *puVar15 = 1;
LAB_0056adec:
            puVar15[1] = (int)lVar14;
            puVar15[2] = uVar18;
            __cxa_throw(puVar15,&badseg::typeinfo,0);
          }
          plVar20 = lines + uVar1;
          *(line_t **)((long)&psVar11->linedef + lVar16) = plVar20;
          uVar23 = (ulong)*psVar21;
          if ((uint)numsides <=
              (uint)((int)((ulong)((long)plVar20->sidedef[uVar23] - (long)sides) >> 3) * 0x684bda13)
             ) {
            puVar15 = (undefined4 *)__cxa_allocate_exception(0xc);
            uVar18 = (int)((ulong)((long)plVar20->sidedef[uVar23] - (long)sides) >> 3) * 0x684bda13;
            *puVar15 = 2;
            goto LAB_0056adec;
          }
          *(side_t **)((long)&psVar11->sidedef + lVar16) = plVar20->sidedef[uVar23];
          *(sector_t **)((long)&psVar11->frontsector + lVar16) = plVar20->sidedef[uVar23]->sector;
          uVar18 = plVar20->flags;
          if (((uVar18 & 4) == 0) || (plVar20->sidedef[uVar23 ^ 1] == (side_t *)0x0)) {
            *(undefined8 *)((long)&psVar11->backsector + lVar16) = 0;
            plVar20->flags = uVar18 & 0xfffffffb;
          }
          else {
            *(sector_t **)((long)&psVar11->backsector + lVar16) =
                 plVar20->sidedef[uVar23 ^ 1]->sector;
          }
          lVar14 = lVar14 + 1;
          psVar21 = psVar21 + 8;
          lVar16 = lVar16 + 0x48;
        } while (lVar14 < numsegs);
      }
      operator_delete__(__s);
      operator_delete__(pvVar13);
      return;
    }
  }
  Printf("This map has no segs.\n");
  if (subsectors != (subsector_t *)0x0) {
    operator_delete__(subsectors);
  }
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  operator_delete__(__s);
  ForceNodeBuild = true;
  return;
}

Assistant:

void P_LoadSegs (MapData * map)
{
	int  i;
	BYTE *data;
	BYTE *vertchanged = new BYTE[numvertexes];	// phares 10/4/98
	DWORD segangle;
	line_t* line;		// phares 10/4/98
	//int ptp_angle;		// phares 10/4/98
	//int delta_angle;	// phares 10/4/98
	int vnum1,vnum2;	// phares 10/4/98
	int lumplen = map->Size(ML_SEGS);

	memset (vertchanged,0,numvertexes); // phares 10/4/98

	numsegs = lumplen / sizeof(segtype);

	if (numsegs == 0)
	{
		Printf ("This map has no segs.\n");
		delete[] subsectors;
		delete[] nodes;
		delete[] vertchanged;
		ForceNodeBuild = true;
		return;
	}

	segs = new seg_t[numsegs];
	memset (segs, 0, numsegs*sizeof(seg_t));

	data = new BYTE[lumplen];
	map->Read(ML_SEGS, data);

	for (i = 0; i < numsubsectors; ++i)
	{
		subsectors[i].firstline = &segs[(size_t)subsectors[i].firstline];
	}

	// phares: 10/4/98: Vertchanged is an array that represents the vertices.
	// Mark those used by linedefs. A marked vertex is one that is not a
	// candidate for movement further down.

	line = lines;
	for (i = 0; i < numlines ; i++, line++)
	{
		vertchanged[line->v1 - vertexes] = vertchanged[line->v2 - vertexes] = 1;
	}

	try
	{
		for (i = 0; i < numsegs; i++)
		{
			seg_t *li = segs + i;
			segtype *ml = ((segtype *) data) + i;

			int side, linedef;
			line_t *ldef;

			vnum1 = ml->V1();
			vnum2 = ml->V2();

			if (vnum1 >= numvertexes || vnum2 >= numvertexes)
			{
				throw badseg(0, i, MAX(vnum1, vnum2));
			}

			li->v1 = &vertexes[vnum1];
			li->v2 = &vertexes[vnum2];

			segangle = (WORD)LittleShort(ml->angle);

			// phares 10/4/98: In the case of a lineseg that was created by splitting
			// another line, it appears that the line angle is inherited from the
			// father line. Due to roundoff, the new vertex may have been placed 'off
			// the line'. When you get close to such a line, and it is very short,
			// it's possible that the roundoff error causes 'firelines', the thin
			// lines that can draw from screen top to screen bottom occasionally. This
			// is due to all the angle calculations that are done based on the line
			// angle, the angles from the viewer to the vertices, and the viewer's
			// angle in the world. In the case of firelines, the rounded-off position
			// of one of the vertices determines one of these angles, and introduces
			// an error in the scaling factor for mapping textures and determining
			// where on the screen the ceiling and floor spans should be shown. For a
			// fireline, the engine thinks the ceiling bottom and floor top are at the
			// midpoint of the screen. So you get ceilings drawn all the way down to the
			// screen midpoint, and floors drawn all the way up. Thus 'firelines'. The
			// name comes from the original sighting, which involved a fire texture.
			//
			// To correct this, reset the vertex that was added so that it sits ON the
			// split line.
			//
			// To know which of the two vertices was added, its number is greater than
			// that of the last of the author-created vertices. If both vertices of the
			// line were added by splitting, pick the higher-numbered one. Once you've
			// changed a vertex, don't change it again if it shows up in another seg.
			//
			// To determine if there's an error in the first place, find the
			// angle of the line between the two seg vertices. If it's one degree or more
			// off, then move one vertex. This may seem insignificant, but one degree
			// errors _can_ cause firelines.

			DAngle ptp_angle = (li->v2->fPos() - li->v1->fPos()).Angle();
			DAngle seg_angle = AngleToFloat(segangle << 16);
			DAngle delta_angle = absangle(ptp_angle, seg_angle);

			if (delta_angle >= 1.)
			{
				double dis = (li->v2->fPos() - li->v1->fPos()).Length();
				DVector2 delta = seg_angle.ToVector(dis);
				if ((vnum2 > vnum1) && (vertchanged[vnum2] == 0))
				{
					li->v2->set(li->v1->fPos() + delta);
					vertchanged[vnum2] = 1; // this was changed
				}
				else if (vertchanged[vnum1] == 0)
				{
					li->v1->set(li->v2->fPos() - delta);
					vertchanged[vnum1] = 1; // this was changed
				}
			}

			linedef = LittleShort(ml->linedef);
			if ((unsigned)linedef >= (unsigned)numlines)
			{
				throw badseg(1, i, linedef);
			}
			ldef = &lines[linedef];
			li->linedef = ldef;
			side = LittleShort(ml->side);
			if ((unsigned)(ldef->sidedef[side] - sides) >= (unsigned)numsides)
			{
				throw badseg(2, i, int(ldef->sidedef[side] - sides));
			}
			li->sidedef = ldef->sidedef[side];
			li->frontsector = ldef->sidedef[side]->sector;

			// killough 5/3/98: ignore 2s flag if second sidedef missing:
			if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
			{
				li->backsector = ldef->sidedef[side^1]->sector;
			}
			else
			{
				li->backsector = 0;
				ldef->flags &= ~ML_TWOSIDED;
			}
		}
	}
	catch (const badseg &bad) // the preferred way is to catch by (const) reference.
	{
		switch (bad.badtype)
		{
		case 0:
			Printf ("Seg %d references a nonexistant vertex %d (max %d).\n", bad.badsegnum, bad.baddata, numvertexes);
			break;

		case 1:
			Printf ("Seg %d references a nonexistant linedef %d (max %d).\n", bad.badsegnum, bad.baddata, numlines);
			break;

		case 2:
			Printf ("The linedef for seg %d references a nonexistant sidedef %d (max %d).\n", bad.badsegnum, bad.baddata, numsides);
			break;
		}
		Printf ("The BSP will be rebuilt.\n");
		delete[] segs;
		delete[] subsectors;
		delete[] nodes;
		ForceNodeBuild = true;
	}

	delete[] vertchanged; // phares 10/4/98
	delete[] data;
}